

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::Abort(TestResponseProxy *this,int line,char *file,string *message)

{
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  (*this->pLogger->_vptr_ILogger[7])
            (this->pLogger,"Abort Error: %s:%d\t\'%s\'",file,line,(message->_M_dataplus)._M_p);
  printf("*** ABORT ERROR: %s:%d\t\'%s\'\n",file,line,(message->_M_dataplus)._M_p);
  this->errorCount = this->errorCount + 1;
  if (this->testResult < kTestResult_AllFail) {
    this->testResult = kTestResult_AllFail;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,file,&local_61);
  std::__cxx11::string::string((string *)&local_60,message);
  trun::AssertError::Add(&this->assertError,kAssert_Abort,line,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void TestResponseProxy::Abort(int line, const char *file, std::string message) {
    pLogger->Debug("Abort Error: %s:%d\t'%s'", file, line, message.c_str());

    printf("*** ABORT ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_AllFail) {
        testResult = kTestResult_AllFail;
    }
    assertError.Add(AssertError::kAssert_Abort, line, file, message);
    TerminateThreadIfNeeded();
}